

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.hpp
# Opt level: O3

void __thiscall Tokenizer::Tokenizer(Tokenizer *this,shared_ptr<Readable> *reader)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  TokenType local_1c [4];
  undefined1 local_9;
  
  (this->reader).super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->reader).super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->reader).super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1
  ;
  (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  this->sourceIndex = 0;
  this->sourceLine = 1;
  this->sourceColumn = 1;
  local_1c[0] = Unknown;
  local_1c[1] = 0;
  local_1c[2] = 0;
  local_1c[3] = 0;
  (this->token).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Token,std::allocator<Token>,char_const(&)[8],TokenType,int,int,int>
            (&(this->token).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Token **)&this->token,(allocator<Token> *)&local_9,(char (*) [8])"Unknown",local_1c,
             (int *)(local_1c + 1),(int *)(local_1c + 2),(int *)(local_1c + 3));
  return;
}

Assistant:

explicit Tokenizer(std::shared_ptr<Readable> reader) noexcept
  : reader{std::move(reader)},
    sourceIndex{0},
    sourceLine{1},
    sourceColumn{1},
    token{std::make_shared<Token>("Unknown", TokenType::Unknown, 0, 0, 0)}
  {}